

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3fa embree::ReflectiveMetalMaterial__sample
                 (ISPCReflectiveMetalMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,
                 DifferentialGeometry *dg,Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RSI;
  Vec3fa *in_RDI;
  Vec3fa *in_R8;
  long in_R9;
  Vec3fa VVar5;
  Sample3f *in_stack_00000008;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  embree local_398 [16];
  Sample3f local_388;
  long local_368;
  Vec3fa *local_360;
  long local_348;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_328;
  Vec3fa *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  Vec3fa *local_2e0;
  undefined8 *local_2d8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 *local_260;
  undefined8 local_258;
  Vec3fa *pVStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined1 *local_120;
  Vec3fa *local_118;
  undefined8 uStack_110;
  undefined1 *local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_368 = in_R9;
  local_360 = in_R8;
  local_348 = in_RSI;
  reflect(local_398,in_R8,(Vec3fa *)(in_R9 + 0x40));
  make_Sample3f(in_RDI,(float)((ulong)&local_388 >> 0x20));
  Sample3f::operator=(in_stack_00000008,&local_388);
  local_318 = (undefined8 *)(local_348 + 0x10);
  local_310 = &local_3a8;
  local_3a8 = *local_318;
  uStack_3a0 = *(undefined8 *)(local_348 + 0x18);
  local_328 = (undefined8 *)(local_368 + 0x40);
  local_320 = local_360;
  local_2d8 = &local_338;
  local_2e0 = local_360;
  uVar1 = *(undefined8 *)&local_360->field_0;
  uVar2 = *(undefined8 *)((long)&local_360->field_0 + 8);
  uVar3 = *local_328;
  uVar4 = *(undefined8 *)(local_368 + 0x48);
  local_18._0_4_ = (float)uVar1;
  local_18._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_10._0_4_ = (float)uVar2;
  uStack_10._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_28._0_4_ = (float)uVar3;
  local_28._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_20._0_4_ = (float)uVar4;
  uStack_20._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_68 = (float)local_18 * (float)local_28;
  local_178 = local_18._4_4_ * local_28._4_4_;
  local_f8 = (float)uStack_10 * (float)uStack_20;
  fStack_5c = uStack_10._4_4_ * uStack_20._4_4_;
  local_248 = CONCAT44(local_178,local_68);
  uStack_240 = CONCAT44(fStack_5c,local_f8);
  local_238 = &local_278;
  local_228 = &local_288;
  local_198 = CONCAT44(local_178,local_178);
  uStack_190 = CONCAT44(local_178,local_178);
  local_218 = &stack0xfffffffffffffd68;
  local_118 = (Vec3fa *)CONCAT44(local_f8,local_f8);
  uStack_110 = CONCAT44(local_f8,local_f8);
  local_208 = &local_2b8;
  local_1c8 = local_68 + local_178;
  fStack_1c4 = local_178 + local_178;
  fStack_1c0 = local_f8 + local_178;
  fStack_1bc = fStack_5c + local_178;
  local_98 = CONCAT44(fStack_1c4,local_1c8);
  uStack_90 = CONCAT44(fStack_1bc,fStack_1c0);
  local_200 = &local_2a8;
  local_1f8 = local_1c8 + local_f8;
  fStack_1f4 = fStack_1c4 + local_f8;
  fStack_1f0 = fStack_1c0 + local_f8;
  fStack_1ec = fStack_1bc + local_f8;
  local_258 = CONCAT44(fStack_1f4,local_1f8);
  pVStack_250 = (Vec3fa *)CONCAT44(fStack_1ec,fStack_1f0);
  local_308 = (undefined8 *)(local_348 + 0x20);
  local_300 = &local_3c8;
  local_3c8 = *local_308;
  uStack_3c0 = *(undefined8 *)(local_348 + 0x28);
  local_2f8 = (undefined8 *)(local_348 + 0x30);
  local_2f0 = &local_3d8;
  local_3d8 = *local_2f8;
  uStack_3d0 = *(undefined8 *)(local_348 + 0x38);
  local_2e8 = local_328;
  local_260 = local_2d8;
  local_230 = local_238;
  local_220 = local_238;
  local_210 = local_218;
  local_1e8 = local_200;
  local_1e0 = local_228;
  local_1d8 = local_238;
  local_1d0 = local_208;
  local_1b8 = local_208;
  local_1b0 = local_200;
  local_1a8 = local_238;
  local_1a0 = local_228;
  local_180 = local_228;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  local_168 = local_248;
  uStack_160 = uStack_240;
  local_150 = local_238;
  local_148 = local_228;
  local_140 = local_238;
  local_138 = local_218;
  local_130 = local_208;
  local_128 = local_238;
  local_120 = local_218;
  local_100 = local_218;
  fStack_f4 = local_f8;
  fStack_f0 = local_f8;
  fStack_ec = local_f8;
  local_e8 = local_248;
  uStack_e0 = uStack_240;
  local_d0 = local_238;
  local_c8 = local_198;
  uStack_c0 = uStack_190;
  local_b8 = local_248;
  uStack_b0 = uStack_240;
  uStack_a0 = uStack_110;
  fStack_64 = local_178;
  fStack_60 = local_f8;
  local_50 = local_2d8;
  local_28 = uVar3;
  uStack_20 = uVar4;
  local_18 = uVar1;
  uStack_10 = uVar2;
  local_338 = local_248;
  uStack_330 = uStack_240;
  local_2b8 = local_98;
  uStack_2b0 = uStack_90;
  local_2a8 = local_258;
  local_288 = local_198;
  uStack_280 = uStack_190;
  local_278 = local_248;
  uStack_270 = uStack_240;
  fresnelConductor(local_f8,local_118,pVStack_250);
  local_38 = (float)local_3a8;
  fStack_34 = (float)((ulong)local_3a8 >> 0x20);
  fStack_30 = (float)uStack_3a0;
  fStack_2c = (float)((ulong)uStack_3a0 >> 0x20);
  local_48 = (float)local_3b8;
  fStack_44 = (float)((ulong)local_3b8 >> 0x20);
  fStack_40 = (float)uStack_3b0;
  fStack_3c = (float)((ulong)uStack_3b0 >> 0x20);
  uVar1 = CONCAT44(fStack_34 * fStack_44,local_38 * local_48);
  *(undefined8 *)&in_RDI->field_0 = uVar1;
  *(ulong *)((long)&in_RDI->field_0 + 8) = CONCAT44(fStack_2c * fStack_3c,fStack_30 * fStack_40);
  VVar5.field_0._8_8_ = local_3a8;
  VVar5.field_0._0_8_ = uVar1;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

Vec3fa ReflectiveMetalMaterial__sample(ISPCReflectiveMetalMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  wi_o = make_Sample3f(reflect(wo,dg.Ns),1.0f);
  return Vec3fa(This->reflectance) * fresnelConductor(dot(wo,dg.Ns),Vec3fa((Vec3fa)This->eta),Vec3fa((Vec3fa)This->k));
}